

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

int create_413_response(http_response_old_t *res,http_request_old_t *req)

{
  int iVar1;
  char status_line [128];
  
  status_line[0x70] = '\0';
  status_line[0x71] = '\0';
  status_line[0x72] = '\0';
  status_line[0x73] = '\0';
  status_line[0x74] = '\0';
  status_line[0x75] = '\0';
  status_line[0x76] = '\0';
  status_line[0x77] = '\0';
  status_line[0x78] = '\0';
  status_line[0x79] = '\0';
  status_line[0x7a] = '\0';
  status_line[0x7b] = '\0';
  status_line[0x7c] = '\0';
  status_line[0x7d] = '\0';
  status_line[0x7e] = '\0';
  status_line[0x7f] = '\0';
  status_line[0x60] = '\0';
  status_line[0x61] = '\0';
  status_line[0x62] = '\0';
  status_line[99] = '\0';
  status_line[100] = '\0';
  status_line[0x65] = '\0';
  status_line[0x66] = '\0';
  status_line[0x67] = '\0';
  status_line[0x68] = '\0';
  status_line[0x69] = '\0';
  status_line[0x6a] = '\0';
  status_line[0x6b] = '\0';
  status_line[0x6c] = '\0';
  status_line[0x6d] = '\0';
  status_line[0x6e] = '\0';
  status_line[0x6f] = '\0';
  status_line[0x50] = '\0';
  status_line[0x51] = '\0';
  status_line[0x52] = '\0';
  status_line[0x53] = '\0';
  status_line[0x54] = '\0';
  status_line[0x55] = '\0';
  status_line[0x56] = '\0';
  status_line[0x57] = '\0';
  status_line[0x58] = '\0';
  status_line[0x59] = '\0';
  status_line[0x5a] = '\0';
  status_line[0x5b] = '\0';
  status_line[0x5c] = '\0';
  status_line[0x5d] = '\0';
  status_line[0x5e] = '\0';
  status_line[0x5f] = '\0';
  status_line[0x40] = '\0';
  status_line[0x41] = '\0';
  status_line[0x42] = '\0';
  status_line[0x43] = '\0';
  status_line[0x44] = '\0';
  status_line[0x45] = '\0';
  status_line[0x46] = '\0';
  status_line[0x47] = '\0';
  status_line[0x48] = '\0';
  status_line[0x49] = '\0';
  status_line[0x4a] = '\0';
  status_line[0x4b] = '\0';
  status_line[0x4c] = '\0';
  status_line[0x4d] = '\0';
  status_line[0x4e] = '\0';
  status_line[0x4f] = '\0';
  status_line[0x30] = '\0';
  status_line[0x31] = '\0';
  status_line[0x32] = '\0';
  status_line[0x33] = '\0';
  status_line[0x34] = '\0';
  status_line[0x35] = '\0';
  status_line[0x36] = '\0';
  status_line[0x37] = '\0';
  status_line[0x38] = '\0';
  status_line[0x39] = '\0';
  status_line[0x3a] = '\0';
  status_line[0x3b] = '\0';
  status_line[0x3c] = '\0';
  status_line[0x3d] = '\0';
  status_line[0x3e] = '\0';
  status_line[0x3f] = '\0';
  status_line[0x20] = '\0';
  status_line[0x21] = '\0';
  status_line[0x22] = '\0';
  status_line[0x23] = '\0';
  status_line[0x24] = '\0';
  status_line[0x25] = '\0';
  status_line[0x26] = '\0';
  status_line[0x27] = '\0';
  status_line[0x28] = '\0';
  status_line[0x29] = '\0';
  status_line[0x2a] = '\0';
  status_line[0x2b] = '\0';
  status_line[0x2c] = '\0';
  status_line[0x2d] = '\0';
  status_line[0x2e] = '\0';
  status_line[0x2f] = '\0';
  status_line[0x10] = '\0';
  status_line[0x11] = '\0';
  status_line[0x12] = '\0';
  status_line[0x13] = '\0';
  status_line[0x14] = '\0';
  status_line[0x15] = '\0';
  status_line[0x16] = '\0';
  status_line[0x17] = '\0';
  status_line[0x18] = '\0';
  status_line[0x19] = '\0';
  status_line[0x1a] = '\0';
  status_line[0x1b] = '\0';
  status_line[0x1c] = '\0';
  status_line[0x1d] = '\0';
  status_line[0x1e] = '\0';
  status_line[0x1f] = '\0';
  status_line[0] = '\0';
  status_line[1] = '\0';
  status_line[2] = '\0';
  status_line[3] = '\0';
  status_line[4] = '\0';
  status_line[5] = '\0';
  status_line[6] = '\0';
  status_line[7] = '\0';
  status_line[8] = '\0';
  status_line[9] = '\0';
  status_line[10] = '\0';
  status_line[0xb] = '\0';
  status_line[0xc] = '\0';
  status_line[0xd] = '\0';
  status_line[0xe] = '\0';
  status_line[0xf] = '\0';
  iVar1 = create_status_line(status_line,0x80,req->http_proto,Entity_Too_Large);
  if (iVar1 == -1) {
    iVar1 = -1;
  }
  else {
    fill_http_response(res,status_line);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int create_413_response(http_response_old_t *res, const http_request_old_t* req)
{
  char status_line[128]={0};
  int ret;
  if((ret = create_status_line(status_line, 128, req->http_proto, Entity_Too_Large)) == -1)
    return -1;
  fill_http_response(res, status_line);

  return 0;
}